

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O2

GDateTime * win_filetime_to_gdatetime(int64_t win_filetime)

{
  long lVar1;
  GDateTime *pGVar2;
  
  lVar1 = (win_filetime + -0x19db1ded53e8000) / 10000000;
  g_log("rifiuti2",0x80,"FileTime -> Epoch: %ld -> %ld",win_filetime,lVar1);
  pGVar2 = (GDateTime *)g_date_time_new_from_unix_utc(lVar1);
  return pGVar2;
}

Assistant:

GDateTime *
win_filetime_to_gdatetime (int64_t win_filetime)
{
    int64_t t;

    /* Let's assume we don't need subsecond time resolution */
    t = (win_filetime - 116444736000000000LL) / 10000000;

    g_debug ("FileTime -> Epoch: %" PRId64
        " -> %" PRId64, win_filetime, t);

    return g_date_time_new_from_unix_utc (t);
}